

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O1

void __thiscall Assimp::JSONWriter::StartArray(JSONWriter *this,bool is_element)

{
  undefined7 in_register_00000031;
  char local_9;
  
  if ((int)CONCAT71(in_register_00000031,is_element) != 0) {
    if ((this->flags & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&this->field_0x58,(this->indent)._M_dataplus._M_p,
                 (this->indent)._M_string_length);
    }
    if (this->first == false) {
      local_9 = ',';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x58,&local_9,1);
    }
  }
  this->first = true;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x58,"[\n",2);
  std::__cxx11::string::push_back((char)this + '\b');
  return;
}

Assistant:

void StartArray(bool is_element = false) {
        // if this appears as a plain array element, we need to insert a delimiter and we should also indent it
        if (is_element) {
            AddIndentation();
            if (!first) {
                buff << ',';
            }
        }
        first = true;
        buff << "[\n";
        PushIndent();
    }